

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSOSerializer.cpp
# Opt level: O0

bool Diligent::RPSerializer<(Diligent::SerializerMode)2>::SerializeDesc
               (Serializer<(Diligent::SerializerMode)2> *Ser,ConstQual<RenderPassDesc> *RPDesc,
               DynamicLinearAllocator *Allocator)

{
  bool bVar1;
  DynamicLinearAllocator *pDStack_28;
  bool res;
  DynamicLinearAllocator *Allocator_local;
  ConstQual<RenderPassDesc> *RPDesc_local;
  Serializer<(Diligent::SerializerMode)2> *Ser_local;
  
  pDStack_28 = Allocator;
  Allocator_local = (DynamicLinearAllocator *)RPDesc;
  RPDesc_local = (ConstQual<RenderPassDesc> *)Ser;
  bVar1 = Serializer<(Diligent::SerializerMode)2>::
          SerializeArray<Diligent::RenderPassAttachmentDesc_const*const,unsigned_int_const,Diligent::RPSerializer<(Diligent::SerializerMode)2>::SerializeDesc(Diligent::Serializer<(Diligent::SerializerMode)2>&,Diligent::RenderPassDesc_const&,Diligent::DynamicLinearAllocator*)::_lambda(Diligent::Serializer<(Diligent::SerializerMode)2>&,Diligent::RenderPassAttachmentDesc_const&)_1_>
                    (Ser,Allocator,&RPDesc->pAttachments,&RPDesc->AttachmentCount);
  if (bVar1) {
    bVar1 = Serializer<(Diligent::SerializerMode)2>::
            SerializeArray<Diligent::SubpassDesc_const*const,unsigned_int_const,Diligent::RPSerializer<(Diligent::SerializerMode)2>::SerializeDesc(Diligent::Serializer<(Diligent::SerializerMode)2>&,Diligent::RenderPassDesc_const&,Diligent::DynamicLinearAllocator*)::_lambda(Diligent::Serializer<(Diligent::SerializerMode)2>&,Diligent::SubpassDesc_const&)_1_>
                      ((Serializer<(Diligent::SerializerMode)2> *)RPDesc_local,pDStack_28,
                       (SubpassDesc **)&Allocator_local->m_pAllocator,&Allocator_local->m_BlockSize,
                       (anon_class_8_1_a223808b)&stack0xffffffffffffffd8);
    if (bVar1) {
      Ser_local._7_1_ =
           Serializer<(Diligent::SerializerMode)2>::
           SerializeArray<Diligent::SubpassDependencyDesc_const*const,unsigned_int_const,Diligent::RPSerializer<(Diligent::SerializerMode)2>::SerializeDesc(Diligent::Serializer<(Diligent::SerializerMode)2>&,Diligent::RenderPassDesc_const&,Diligent::DynamicLinearAllocator*)::_lambda(Diligent::Serializer<(Diligent::SerializerMode)2>&,Diligent::SubpassDependencyDesc_const&)_1_>
                     ((Serializer<(Diligent::SerializerMode)2> *)RPDesc_local,pDStack_28,
                      &Allocator_local[1].m_Blocks.
                       super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
                       ._M_impl.super__Vector_impl_data._M_finish,Allocator_local + 1);
    }
    else {
      Ser_local._7_1_ = false;
    }
  }
  else {
    Ser_local._7_1_ = false;
  }
  return Ser_local._7_1_;
}

Assistant:

bool RPSerializer<Mode>::SerializeDesc(
    Serializer<Mode>&          Ser,
    ConstQual<RenderPassDesc>& RPDesc,
    DynamicLinearAllocator*    Allocator)
{
    auto res =
        Ser.SerializeArray(Allocator, RPDesc.pAttachments, RPDesc.AttachmentCount,
                           [](Serializer<Mode>&                    Ser,
                              ConstQual<RenderPassAttachmentDesc>& Attachment) //
                           {
                               return Ser(Attachment.Format,
                                          Attachment.SampleCount,
                                          Attachment.LoadOp,
                                          Attachment.StoreOp,
                                          Attachment.StencilLoadOp,
                                          Attachment.StencilStoreOp,
                                          Attachment.InitialState,
                                          Attachment.FinalState);
                           });
    if (!res) return false;

    res =
        Ser.SerializeArray(Allocator, RPDesc.pSubpasses, RPDesc.SubpassCount,
                           [&Allocator](Serializer<Mode>&       Ser,
                                        ConstQual<SubpassDesc>& Subpass) //
                           {
                               auto SerializeAttachmentRef = [](Serializer<Mode>&               Ser,
                                                                ConstQual<AttachmentReference>& AttachRef) //
                               {
                                   return Ser(AttachRef.AttachmentIndex,
                                              AttachRef.State);
                               };

                               if (!Ser.SerializeArray(Allocator, Subpass.pInputAttachments, Subpass.InputAttachmentCount, SerializeAttachmentRef))
                                   return false;
                               if (!Ser.SerializeArray(Allocator, Subpass.pRenderTargetAttachments, Subpass.RenderTargetAttachmentCount, SerializeAttachmentRef))
                                   return false;

                               // Note: in Read mode, ResolveAttachCount, DepthStencilAttachCount, and ShadingRateAttachCount will be overwritten
                               Uint32 ResolveAttachCount = Subpass.pResolveAttachments != nullptr ? Subpass.RenderTargetAttachmentCount : 0;
                               if (!Ser.SerializeArray(Allocator, Subpass.pResolveAttachments, ResolveAttachCount, SerializeAttachmentRef))
                                   return false;

                               Uint32 DepthStencilAttachCount = Subpass.pDepthStencilAttachment != nullptr ? 1 : 0;
                               if (!Ser.SerializeArray(Allocator, Subpass.pDepthStencilAttachment, DepthStencilAttachCount, SerializeAttachmentRef))
                                   return false;


                               if (!Ser.SerializeArray(Allocator, Subpass.pPreserveAttachments, Subpass.PreserveAttachmentCount,
                                                       [](Serializer<Mode>&  Ser,
                                                          ConstQual<Uint32>& Attach) //
                                                       {
                                                           return Ser(Attach);
                                                       }))
                                   return false;

                               Uint32 ShadingRateAttachCount = Subpass.pShadingRateAttachment != nullptr ? 1 : 0;
                               return Ser.SerializeArray(Allocator, Subpass.pShadingRateAttachment, ShadingRateAttachCount,
                                                         [](Serializer<Mode>&                 Ser,
                                                            ConstQual<ShadingRateAttachment>& SRAttachment) //
                                                         {
                                                             return Ser(SRAttachment.Attachment.AttachmentIndex,
                                                                        SRAttachment.Attachment.State,
                                                                        SRAttachment.TileSize);
                                                         });
                           });
    if (!res) return false;

    res =
        Ser.SerializeArray(Allocator, RPDesc.pDependencies, RPDesc.DependencyCount,
                           [](Serializer<Mode>&                 Ser,
                              ConstQual<SubpassDependencyDesc>& Dep) //
                           {
                               return Ser(Dep.SrcSubpass,
                                          Dep.DstSubpass,
                                          Dep.SrcStageMask,
                                          Dep.DstStageMask,
                                          Dep.SrcAccessMask,
                                          Dep.DstAccessMask);
                           });
    return res;

    ASSERT_SIZEOF64(RenderPassDesc, 56, "Did you add a new member to RenderPassDesc? Please add serialization here.");
    ASSERT_SIZEOF64(SubpassDesc, 72, "Did you add a new member to SubpassDesc? Please add serialization here.");
    ASSERT_SIZEOF(RenderPassAttachmentDesc, 16, "Did you add a new member to RenderPassAttachmentDesc? Please add serialization here.");
    ASSERT_SIZEOF(SubpassDependencyDesc, 24, "Did you add a new member to SubpassDependencyDesc? Please add serialization here.");
    ASSERT_SIZEOF(ShadingRateAttachment, 16, "Did you add a new member to ShadingRateAttachment? Please add serialization here.");
    ASSERT_SIZEOF(AttachmentReference, 8, "Did you add a new member to AttachmentReference? Please add serialization here.");
}